

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall ExprTest_ConversionToExpr_Test::TestBody(ExprTest_ConversionToExpr_Test *this)

{
  mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
            (&(this->super_ExprTest).factory_,42.0);
  return;
}

Assistant:

TEST_F(ExprTest, ConversionToExpr) {
  // Test that NumericConstant is not convertible to Expr&. If it was
  // convertible there would be an error because of an ambiguous call.
  // The conversion is forbidden because it compromises type safety
  // as illustrated in the following example:
  //   auto n = factory_.MakeNumericConstant(42);
  //   auto u = MakeUnary(expr::ABS, n);
  //   Expr &e = n;
  //   e = u;
  struct Test {
    static void f(Expr) {}
    static void f(Expr &) {}
  };
  auto n = factory_.MakeNumericConstant(42);
  Test::f(n);
}